

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(longlong lhs,SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  longlong ret;
  short local_1a;
  longlong local_18;
  longlong local_10;
  
  local_10 = 0;
  local_1a = rhs.m_int;
  local_18 = lhs;
  DivisionHelper<long_long,_short,_5>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_18,&local_1a,&local_10);
  if ((short)local_10 != local_10) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
  return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)(short)local_10;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}